

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O1

void TestMap<TCMalloc_PageMap1<10>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  bool bVar1;
  size_t __i;
  void *pvVar2;
  AssertHelperData *pAVar3;
  undefined8 *__s;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  AssertHelperData *pAVar7;
  AssertHelperData *pAVar8;
  undefined1 local_1408 [8];
  AssertionResult gtest_ar;
  AssertHelper local_68;
  bool local_59;
  bool bStack_58;
  undefined7 uStack_57;
  bool limit_is_below_the_overflow_boundary_local;
  vector<long,_std::allocator<long>_> elements;
  AssertHelper local_38;
  
  local_59 = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n");
  pvVar2 = malloc(0x2000);
  memset(pvVar2,0,0x2000);
  pAVar3 = (AssertHelperData *)(long)limit;
  if (0 < limit) {
    pAVar8 = (AssertHelperData *)0x0;
    do {
      pAVar7 = (AssertHelperData *)((long)&pAVar8->type + 1);
      *(AssertHelperData **)((long)pvVar2 + (long)pAVar8 * 8) = pAVar7;
      _bStack_58 = (long *)(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
      if (pAVar8 < (AssertHelperData *)0x400) {
        _bStack_58 = (long *)pAVar7;
      }
      local_38.data_ = pAVar7;
      testing::internal::CmpHelperEQ<void*,void*>
                ((internal *)local_1408,"map.get(i)","(void*)(i+1)",
                 (void **)&stack0xffffffffffffffa8,&local_38.data_);
      if (local_1408[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffa8);
        if (gtest_ar._0_8_ == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffa8);
        goto LAB_001093ea;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      pAVar8 = pAVar7;
    } while (pAVar3 != pAVar7);
  }
  if (0 < limit) {
    pAVar8 = (AssertHelperData *)0x0;
    do {
      if (pAVar8 < (AssertHelperData *)0x400) {
        _bStack_58 = *(long **)&((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)pvVar2 + (long)pAVar8 * 8))->_M_t;
      }
      else {
        _bStack_58 = (long *)0x0;
      }
      pAVar8 = (AssertHelperData *)((long)&pAVar8->type + 1);
      local_38.data_ = pAVar8;
      testing::internal::CmpHelperEQ<void*,void*>
                ((internal *)local_1408,"map.get(i)","(void*)(i+1)",
                 (void **)&stack0xffffffffffffffa8,&local_38.data_);
      if (local_1408[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffa8);
        if (gtest_ar._0_8_ == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffa8);
        goto LAB_001093ea;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
    } while (pAVar3 != pAVar8);
  }
  __s = (undefined8 *)malloc(0x2000);
  memset(__s,0,0x2000);
  bVar1 = 0 < limit;
  if (0 < limit) {
    *__s = 1;
    _bStack_58 = (long *)0x1;
    local_38.data_ = (AssertHelperData *)0x1;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1408,"map.get(i)","(void*)(i+1)",(void **)&stack0xffffffffffffffa8,
               &local_38.data_);
    if (local_1408[0] == (internal)0x1) {
      pAVar8 = (AssertHelperData *)0x1;
      do {
        pAVar7 = pAVar8;
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        if (pAVar3 == pAVar7) goto LAB_00109032;
        pAVar8 = (AssertHelperData *)((long)&pAVar7->type + 1);
        __s[(long)pAVar7] = pAVar8;
        _bStack_58 = (long *)(AssertHelperData *)0x0;
        if (pAVar7 < (AssertHelperData *)0x400) {
          _bStack_58 = (long *)pAVar8;
        }
        local_38.data_ = pAVar8;
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)local_1408,"map.get(i)","(void*)(i+1)",
                   (void **)&stack0xffffffffffffffa8,&local_38.data_);
      } while (local_1408[0] != (internal)0x0);
      bVar1 = (long)pAVar7 < (long)pAVar3;
    }
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x47,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((AssertHelperData *)_bStack_58 != (AssertHelperData *)0x0) {
      (**(code **)(*_bStack_58 + 8))();
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    if (bVar1) {
      return;
    }
  }
LAB_00109032:
  if (0 < limit) {
    pAVar8 = (AssertHelperData *)0x0;
    do {
      if (pAVar8 < (AssertHelperData *)0x400) {
        _bStack_58 = (long *)__s[(long)pAVar8];
      }
      else {
        _bStack_58 = (long *)0x0;
      }
      pAVar8 = (AssertHelperData *)((long)&pAVar8->type + 1);
      local_38.data_ = pAVar8;
      testing::internal::CmpHelperEQ<void*,void*>
                ((internal *)local_1408,"map.get(i)","(void*)(i+1)",
                 (void **)&stack0xffffffffffffffa8,&local_38.data_);
      if (local_1408[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffa8);
        if (gtest_ar._0_8_ == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x4a,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffa8);
LAB_001093ea:
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_bStack_58 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*_bStack_58 + 8))();
        }
        if (gtest_ar._0_8_ == 0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
        return;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
    } while (pAVar3 != pAVar8);
  }
  bStack_58 = (ulong)(long)(limit + 1) <= 0x400U - (long)pAVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_1408,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",&stack0xffffffffffffffa8,&local_59);
  if (local_1408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_bStack_58 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*_bStack_58 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (local_1408[0] != (internal)0x0) {
    _bStack_58 = (long *)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1408 = (undefined1  [8])0x0;
    if (0 < limit) {
      do {
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start ==
            elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&stack0xffffffffffffffa8,
                     (iterator)
                     elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start,(long *)local_1408);
        }
        else {
          *elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start = (long)local_1408;
          elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        }
        local_1408 = (undefined1  [8])((long)local_1408 + 1);
      } while ((long)local_1408 < (long)pAVar3);
    }
    local_1408 = (undefined1  [8])0x2a;
    lVar4 = 1;
    uVar5 = 0x2a;
    do {
      uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4);
      *(ulong *)(local_1408 + lVar4 * 8) = uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (_bStack_58,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_1408);
    pvVar2 = malloc(0x2000);
    memset(pvVar2,0,0x2000);
    if (0 < limit) {
      pAVar8 = (AssertHelperData *)0x0;
      do {
        lVar4 = *(long *)((long)_bStack_58 + (long)pAVar8 * 8);
        *(long *)((long)pvVar2 + lVar4 * 8) = lVar4 + 1;
        uVar5 = *(ulong *)((long)_bStack_58 + (long)pAVar8 * 8);
        if (uVar5 < 0x400) {
          local_38.data_ = *(AssertHelperData **)((long)pvVar2 + uVar5 * 8);
        }
        else {
          local_38.data_ = (AssertHelperData *)0x0;
        }
        local_68.data_ = (AssertHelperData *)(*(long *)((long)_bStack_58 + (long)pAVar8 * 8) + 1);
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)local_1408,"map.get(elements[i])","(void*)(elements[i]+1)",
                   &local_38.data_,&local_68.data_);
        if (local_1408[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (gtest_ar._0_8_ == 0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x5d,pcVar6);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_38);
          goto LAB_001094be;
        }
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        pAVar8 = (AssertHelperData *)((long)&pAVar8->type + 1);
      } while (pAVar3 != pAVar8);
    }
    if (0 < limit) {
      pAVar8 = (AssertHelperData *)0x0;
LAB_00109354:
      if (pAVar8 < (AssertHelperData *)0x400) {
        local_38.data_ = *(AssertHelperData **)((long)pvVar2 + (long)pAVar8 * 8);
      }
      else {
        local_38.data_ = (AssertHelperData *)0x0;
      }
      pAVar8 = (AssertHelperData *)((long)&pAVar8->type + 1);
      local_68.data_ = pAVar8;
      testing::internal::CmpHelperEQ<void*,void*>
                ((internal *)local_1408,"map.get(i)","(void*)(i+1)",&local_38.data_,&local_68.data_)
      ;
      if (local_1408[0] != (internal)0x0) goto code_r0x00109399;
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x60,pcVar6);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_38);
LAB_001094be:
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_38.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_38.data_ + 8))();
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
    }
LAB_001094ee:
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_bStack_58 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(_bStack_58,
                      (long)elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)_bStack_58);
    }
  }
  return;
code_r0x00109399:
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (pAVar3 == pAVar8) goto LAB_001094ee;
  goto LAB_00109354;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}